

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

realtype N_VMinQuotient_Serial(N_Vector num,N_Vector denom)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  lVar4 = (long)*num->content;
  if (lVar4 < 1) {
    return 1.79769313486232e+308;
  }
  bVar1 = true;
  lVar5 = 0;
  dVar6 = 1.79769313486232e+308;
  do {
    dVar8 = *(double *)(*(long *)((long)denom->content + 8) + lVar5 * 8);
    if ((dVar8 != 0.0) || (dVar7 = dVar6, NAN(dVar8))) {
      bVar3 = false;
      dVar8 = *(double *)(*(long *)((long)num->content + 8) + lVar5 * 8) / dVar8;
      bVar2 = !bVar1;
      dVar7 = dVar8;
      bVar1 = bVar3;
      if ((bVar2) && (dVar7 = dVar6, dVar8 <= dVar6)) {
        dVar7 = dVar8;
      }
    }
    lVar5 = lVar5 + 1;
    dVar6 = dVar7;
  } while (lVar4 != lVar5);
  return dVar7;
}

Assistant:

realtype N_VMinQuotient_Serial(N_Vector num, N_Vector denom)
{
  booleantype notEvenOnce;
  sunindextype i, N;
  realtype *nd, *dd, min;

  nd = dd = NULL;

  N  = NV_LENGTH_S(num);
  nd = NV_DATA_S(num);
  dd = NV_DATA_S(denom);

  notEvenOnce = SUNTRUE;
  min = BIG_REAL;

  for (i = 0; i < N; i++) {
    if (dd[i] == ZERO) continue;
    else {
      if (!notEvenOnce) min = SUNMIN(min, nd[i]/dd[i]);
      else {
	min = nd[i]/dd[i];
        notEvenOnce = SUNFALSE;
      }
    }
  }

  return(min);
}